

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O1

void SplitVarnode::createBoolOp
               (Funcdata *data,PcodeOp *cbranch,SplitVarnode *in1,SplitVarnode *in2,OpCode opc)

{
  PcodeOp *pPVar1;
  Varnode *pVVar2;
  
  pVVar2 = (cbranch->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  pPVar1 = cbranch;
  if ((pVVar2->flags & 0x10) != 0) {
    pPVar1 = pVVar2->def;
  }
  findCreateWhole(in1,data);
  findCreateWhole(in2,data);
  pPVar1 = Funcdata::newOp(data,2,&(pPVar1->start).pc);
  Funcdata::opSetOpcode(data,pPVar1,opc);
  pVVar2 = Funcdata::newUniqueOut(data,1,pPVar1);
  Funcdata::opSetInput(data,pPVar1,in1->whole,0);
  Funcdata::opSetInput(data,pPVar1,in2->whole,1);
  Funcdata::opInsertBefore(data,pPVar1,cbranch);
  Funcdata::opSetInput(data,cbranch,pVVar2,1);
  return;
}

Assistant:

void SplitVarnode::createBoolOp(Funcdata &data,PcodeOp *cbranch,SplitVarnode &in1,SplitVarnode &in2,
				OpCode opc)

{ // Create a new boolean op which replaces the boolean taken as input by -cbranch- with a double
  // precision version.
  PcodeOp *addrop = cbranch;
  Varnode *boolvn = cbranch->getIn(1);
  if (boolvn->isWritten())
    addrop = boolvn->getDef();	// Use the address of the comparison operator
  in1.findCreateWhole(data);
  in2.findCreateWhole(data);
  PcodeOp *newop = data.newOp(2,addrop->getAddr());
  data.opSetOpcode(newop,opc);
  Varnode *newbool = data.newUniqueOut(1,newop);
  data.opSetInput(newop,in1.getWhole(),0);
  data.opSetInput(newop,in2.getWhole(),1);
  data.opInsertBefore(newop,cbranch);
  data.opSetInput(cbranch,newbool,1); // CBRANCH now determined by new compare
}